

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O3

int __thiscall
HashMap<Socket_*,_unsigned_int>::remove(HashMap<Socket_*,_unsigned_int> *this,char *__filename)

{
  int in_EAX;
  uint uVar1;
  Iterator it;
  Item *local_8;
  
  if (this->data != (Item **)0x0) {
    for (local_8 = this->data[((ulong)*(Socket **)__filename >> 3) % this->capacity];
        local_8 != (Item *)0x0; local_8 = local_8->nextCell) {
      if (local_8->key == *(Socket **)__filename) {
        if (local_8 != (this->_end).item) {
          uVar1 = remove(this,(char *)&local_8);
          local_8 = (Item *)(ulong)uVar1;
        }
        break;
      }
    }
    in_EAX = (int)local_8;
  }
  return in_EAX;
}

Assistant:

Iterator find(const T& key) const
  {
    if(!data) return _end;
    usize hashCode = hash(key);
    Item* item = data[hashCode % capacity];
    while(item)
    {
      if(item->key == key) return item;
      item = item->nextCell;
    }
    return _end;
  }